

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O2

int LuaError(lua_State *L)

{
  char *pcVar1;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pcVar1 = (*lua_tolstring)(L,1,(size_t *)0x0);
  std::__cxx11::string::string((string *)&msg,pcVar1,(allocator *)&local_30);
  std::operator+(&local_30,"[Emmy]",&msg);
  std::__cxx11::string::operator=((string *)&msg,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  lua_getglobal(L,"error");
  (*lua_pushstring)(L,msg._M_dataplus._M_p);
  lua_call(L,1,0);
  std::__cxx11::string::~string((string *)&msg);
  return 0;
}

Assistant:

int LuaError(lua_State *L) {
	std::string msg = lua_tostring(L, 1);
	msg = "[Emmy]" + msg;
	lua_getglobal(L, "error");
	lua_pushstring(L, msg.c_str());
	lua_call(L, 1, 0);
	return 0;
}